

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLReader::skippedStringLong(XMLReader *this,XMLCh *toSkip)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  XMLSize_t local_58;
  XMLSize_t n;
  XMLSize_t tmp;
  XMLSize_t charsLeft;
  XMLSize_t srcLen;
  XMLCh *toSkip_local;
  XMLReader *this_local;
  
  charsLeft = XMLString::stringLen(toSkip);
  tmp = charsLeftInBuffer(this);
  srcLen = (XMLSize_t)toSkip;
  do {
    if (charsLeft == 0) {
      return true;
    }
    while (tmp < charsLeft && tmp != 0x4000) {
      bVar1 = refreshCharBuffer(this);
      if (!bVar1) {
        return false;
      }
      XVar3 = charsLeftInBuffer(this);
      bVar1 = XVar3 == tmp;
      tmp = XVar3;
      if (bVar1) {
        return false;
      }
    }
    if (tmp < charsLeft) {
      local_58 = tmp;
    }
    else {
      local_58 = charsLeft;
    }
    iVar2 = memcmp(this->fCharBuf + this->fCharIndex,(void *)srcLen,local_58 << 1);
    if (iVar2 != 0) {
      return false;
    }
    srcLen = local_58 * 2 + srcLen;
    charsLeft = charsLeft - local_58;
    this->fCharIndex = local_58 + this->fCharIndex;
    this->fCurCol = local_58 + this->fCurCol;
    tmp = tmp - local_58;
  } while( true );
}

Assistant:

bool XMLReader::skippedStringLong(const XMLCh* toSkip)
{
    // This function works on strings that are potentially longer than
    // kCharBufSize (e.g., end tag). This function does not guarantee
    // that in case the comparison is unsuccessful the fCharIndex will
    // point to the original data.
    //

    XMLSize_t srcLen = XMLString::stringLen(toSkip);
    XMLSize_t charsLeft = charsLeftInBuffer();

    while (srcLen != 0)
    {
      // Fill up the buffer with as much data as possible.
      //
      while (charsLeft < srcLen && charsLeft != kCharBufSize)
      {
        if (!refreshCharBuffer())
          return false;

        XMLSize_t tmp = charsLeftInBuffer();
        if (tmp == charsLeft) // if the refreshCharBuf() did not add anything
          return false;       // new give up and return.

        charsLeft = tmp;
      }

      XMLSize_t n = charsLeft < srcLen ? charsLeft : srcLen;

      if (memcmp(&fCharBuf[fCharIndex], toSkip, n * sizeof(XMLCh)))
        return false;

      toSkip += n;
      srcLen -= n;

      fCharIndex += n;
      fCurCol += (XMLFileLoc)n;
      charsLeft -= n;
    }

    return true;
}